

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBTypes.cpp
# Opt level: O2

USBSignalState * __thiscall
USBSignalFilter::GetState(USBSignalState *__return_storage_ptr__,USBSignalFilter *this)

{
  U64 UVar1;
  int iVar2;
  int iVar3;
  USBState UVar4;
  U64 UVar5;
  long lVar6;
  undefined1 auVar7 [16];
  
  UVar1 = this->mStateStartSample;
  __return_storage_ptr__->mSampleBegin = UVar1;
  iVar2 = AnalyzerChannelData::GetBitState();
  iVar3 = AnalyzerChannelData::GetBitState();
  if (iVar2 == iVar3) {
    UVar4 = S_SE1 - (iVar2 == 0);
  }
  else {
    UVar4 = (USBState)((iVar2 != 0) != (this->mSpeed == LOW_SPEED));
  }
  __return_storage_ptr__->mState = UVar4;
  UVar5 = DoFilter(this,this->mDP,this->mDM);
  lVar6 = UVar5 - UVar1;
  auVar7._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar7._0_8_ = lVar6;
  auVar7._12_4_ = 0x45300000;
  this->mStateStartSample = UVar5;
  __return_storage_ptr__->mDur =
       ((auVar7._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) * this->mSampleDur;
  __return_storage_ptr__->mSampleEnd = UVar5;
  return __return_storage_ptr__;
}

Assistant:

USBSignalState USBSignalFilter::GetState()
{
    USBSignalState ret_val;

    ret_val.mSampleBegin = mStateStartSample;

    // determine the USB signal state
    BitState dp_state = mDP->GetBitState();
    BitState dm_state = mDM->GetBitState();
    if( dp_state == dm_state )
        ret_val.mState = dp_state == BIT_LOW ? S_SE0 : S_SE1;
    else
        ret_val.mState = ( mSpeed == LOW_SPEED ? ( dp_state == BIT_LOW ? S_J : S_K ) : ( dp_state == BIT_LOW ? S_K : S_J ) );

    // do the filtering and remember the sample begin for the next iteration
    mStateStartSample = DoFilter( mDP, mDM );

    ret_val.mDur = ( mStateStartSample - ret_val.mSampleBegin ) * mSampleDur;
    ret_val.mSampleEnd = mStateStartSample;

    return ret_val;
}